

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O0

float __thiscall
Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>::
get_ideal_clock_rate_in_range
          (LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true> *this,
          float minimum,float maximum)

{
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock_guard;
  float maximum_local;
  float minimum_local;
  LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true> *this_local;
  
  lock_guard._M_device._0_4_ = maximum;
  lock_guard._M_device._4_4_ = minimum;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->filter_parameters_mutex_);
  if ((((this->filter_parameters_).high_frequency_cutoff <= 0.0) ||
      ((this->filter_parameters_).input_cycles_per_second <
       (this->filter_parameters_).high_frequency_cutoff * 3.0)) ||
     ((this->filter_parameters_).high_frequency_cutoff * 3.0 <
      (this->filter_parameters_).input_cycles_per_second)) {
    if (((this->filter_parameters_).input_cycles_per_second < lock_guard._M_device._4_4_) ||
       (lock_guard._M_device._0_4_ < (this->filter_parameters_).input_cycles_per_second)) {
      if (lock_guard._M_device._4_4_ <= (this->filter_parameters_).input_cycles_per_second) {
        this_local._4_4_ = lock_guard._M_device._0_4_;
      }
      else {
        this_local._4_4_ = lock_guard._M_device._4_4_;
      }
    }
    else {
      this_local._4_4_ = (this->filter_parameters_).input_cycles_per_second;
    }
  }
  else {
    this_local._4_4_ = (this->filter_parameters_).high_frequency_cutoff * 3.0;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return this_local._4_4_;
}

Assistant:

float get_ideal_clock_rate_in_range(float minimum, float maximum) final {
			std::lock_guard lock_guard(filter_parameters_mutex_);

			// Return twice the cut off, if applicable.
			if(	filter_parameters_.high_frequency_cutoff > 0.0f &&
				filter_parameters_.input_cycles_per_second >= filter_parameters_.high_frequency_cutoff * 3.0f &&
				filter_parameters_.input_cycles_per_second <= filter_parameters_.high_frequency_cutoff * 3.0f)
					return filter_parameters_.high_frequency_cutoff * 3.0f;

			// Return exactly the input rate if possible.
			if(	filter_parameters_.input_cycles_per_second >= minimum &&
				filter_parameters_.input_cycles_per_second <= maximum)
					return filter_parameters_.input_cycles_per_second;

			// If the input rate is lower, return the minimum...
			if(filter_parameters_.input_cycles_per_second < minimum)
				return minimum;

			// ... otherwise, return the maximum.
			return maximum;
		}